

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  uint uVar6;
  ostream *poVar7;
  char *args;
  BasePort *this;
  void *this_00;
  char local_1a70 [8];
  ofstream outFile;
  uchar local_1868 [3];
  uchar rise_time;
  bool useDS2480B;
  uchar family_code;
  uchar ds_reset;
  bool ret;
  uchar buffer [2048];
  uint32_t status;
  uint32_t fver;
  AmpIO Board;
  BasePort *Port;
  stringstream debugStream;
  ostream local_1d0 [376];
  undefined4 local_58;
  int local_44;
  string local_40 [4];
  int args_found;
  string portDescription;
  int board;
  int i;
  char **argv_local;
  int argc_local;
  
  portDescription.field_2._8_4_ = 0;
  BasePort::DefaultPort_abi_cxx11_();
  if (1 < argc) {
    local_44 = 0;
    for (portDescription.field_2._12_4_ = 1; (int)portDescription.field_2._12_4_ < argc;
        portDescription.field_2._12_4_ = portDescription.field_2._12_4_ + 1) {
      if (*argv[(int)portDescription.field_2._12_4_] == '-') {
        if (argv[(int)portDescription.field_2._12_4_][1] != 'p') {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Usage: instrument <board-num> [-pP]");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"       where <board-num> = rotary switch setting (0-15)")
          ;
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"             P = port number (default 0)");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"       can also specify -pfwP, -pethP or -pudp");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 0;
          local_58 = 1;
          goto LAB_00106686;
        }
        std::__cxx11::string::operator=(local_40,argv[(int)portDescription.field_2._12_4_] + 2);
      }
      else {
        if (local_44 == 0) {
          portDescription.field_2._8_4_ = atoi(argv[(int)portDescription.field_2._12_4_]);
        }
        local_44 = local_44 + 1;
      }
    }
  }
  _Var5 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&Port,_Var5);
  args = (char *)std::__cxx11::string::c_str();
  this = PortFactory(args,local_1d0);
  if (this == (BasePort *)0x0) {
    PrintDebugStream((stringstream *)&Port);
    poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to create port using: ");
    poVar7 = std::operator<<(poVar7,local_40);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    local_58 = 1;
  }
  else {
    uVar6 = (*this->_vptr_BasePort[0x11])();
    if ((uVar6 & 1) == 0) {
      PrintDebugStream((stringstream *)&Port);
      poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to initialize ");
      BasePort::GetPortTypeString_abi_cxx11_((string *)&Board.WB_CTRL_OFFSET,this);
      poVar7 = std::operator<<(poVar7,(string *)&Board.WB_CTRL_OFFSET);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&Board.WB_CTRL_OFFSET);
      argv_local._4_4_ = -1;
      local_58 = 1;
    }
    else {
      AmpIO::AmpIO((AmpIO *)&status,portDescription.field_2._M_local_buf[8]);
      (*this->_vptr_BasePort[0xd])();
      buffer._2044_4_ = BoardIO::GetFirmwareVersion((BoardIO *)&status);
      if ((uint)buffer._2044_4_ < 7) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Instrument read requires firmware version 7+ (detected version ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,buffer._2044_4_);
        poVar7 = std::operator<<(poVar7,")");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        (*this->_vptr_BasePort[0xe])(this,(ulong)(byte)portDescription.field_2._M_local_buf[8]);
        if (this != (BasePort *)0x0) {
          (*this->_vptr_BasePort[0xb])();
        }
        argv_local._4_4_ = -1;
        local_58 = 1;
      }
      else {
        buffer._2040_4_ = BoardIO::ReadStatus((BoardIO *)&status);
        bVar1 = AmpIO::DallasReadMemory((AmpIO *)&status,0,local_1868,0x800);
        bVar2 = AmpIO::DallasReadStatus((AmpIO *)&status,(uint32_t *)(buffer + 0x7f8));
        if (bVar2) {
          (*this->_vptr_BasePort[0xe])(this,(ulong)(byte)portDescription.field_2._M_local_buf[8]);
          if (this != (BasePort *)0x0) {
            (*this->_vptr_BasePort[0xb])();
          }
          if ((buffer._2040_4_ & 1) == 1) {
            cVar3 = (char)((buffer._2040_4_ & 6) >> 1);
            if (cVar3 == '\x01') {
              bVar4 = SUB41(buffer._2040_4_,3);
              if (bVar4 == 0xb) {
                if ((buffer._2040_4_ & 0x8000) != 0x8000) {
                  uVar6 = (uint)buffer._2040_4_ >> 0x10;
                  poVar7 = std::operator<<((ostream *)&std::cout,"Measured rise time: ");
                  poVar7 = (ostream *)
                           std::ostream::operator<<(poVar7,(double)(uVar6 & 0xff) / 49.152);
                  poVar7 = std::operator<<(poVar7," microseconds");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                }
                if (bVar1) {
                  std::ofstream::ofstream(local_1a70,"instrument.txt",_S_bin);
                  bVar4 = std::ios::good();
                  if ((bVar4 & 1) == 0) {
                    poVar7 = std::operator<<((ostream *)&std::cerr,
                                             "Failed to open instrument.txt for writing");
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    argv_local._4_4_ = -1;
                  }
                  else {
                    std::ostream::write(local_1a70,(long)local_1868);
                    poVar7 = std::operator<<((ostream *)&std::cout,"Data written to instrument.txt")
                    ;
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    std::ofstream::close();
                    argv_local._4_4_ = 0;
                  }
                  local_58 = 1;
                  std::ofstream::~ofstream(local_1a70);
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read instrument memory")
                  ;
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  argv_local._4_4_ = -1;
                  local_58 = 1;
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown device family code: 0x");
                this_00 = (void *)std::ostream::operator<<(poVar7,std::hex);
                poVar7 = (ostream *)std::ostream::operator<<(this_00,(uint)bVar4);
                poVar7 = std::operator<<(poVar7," (DS2505 should be 0x0B)");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
                local_58 = 1;
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to communicate with DS2505");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              if (cVar3 == '\x02') {
                poVar7 = std::operator<<((ostream *)&std::cerr,
                                         "  - DOUT3 did not reach high state -- is pullup resistor missing?"
                                        );
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              else if (cVar3 == '\x03') {
                poVar7 = std::operator<<((ostream *)&std::cerr,
                                         "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?"
                                        );
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              argv_local._4_4_ = -1;
              local_58 = 1;
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "DS2505 interface not enabled (hardware problem)");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = -1;
            local_58 = 1;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read DS2505 status");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          (*this->_vptr_BasePort[0xe])(this,(ulong)(byte)portDescription.field_2._M_local_buf[8]);
          if (this != (BasePort *)0x0) {
            (*this->_vptr_BasePort[0xb])();
          }
          argv_local._4_4_ = -1;
          local_58 = 1;
        }
      }
      AmpIO::~AmpIO((AmpIO *)&status);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&Port);
LAB_00106686:
  std::__cxx11::string::~string(local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else {
                    std::cerr << "Usage: instrument <board-num> [-pP]" << std::endl
                              << "       where <board-num> = rotary switch setting (0-15)" << std::endl
                              << "             P = port number (default 0)" << std::endl
                              << "       can also specify -pfwP, -pethP or -pudp" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0)
                    board = atoi(argv[i]);
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    uint32_t fver = Board.GetFirmwareVersion();
    if (fver < 7) {
        std::cerr << "Instrument read requires firmware version 7+ (detected version " << fver << ")" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    uint32_t status = Board.ReadStatus();

    // Now, we try to read the Dallas chip. This will also populate the status field.
    unsigned char buffer[2048];  // Buffer for entire contents of DS2505 memory (2 Kbytes)
    bool ret = Board.DallasReadMemory(0, (unsigned char *) buffer, sizeof(buffer));
    if (!Board.DallasReadStatus(status)) {
        std::cerr << "Failed to read DS2505 status" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    // No longer need these
    Port->RemoveBoard(board);
    delete Port;
    if ((status & 0x00000001) != 0x00000001) {
        std::cerr << "DS2505 interface not enabled (hardware problem)" << std::endl;
        return -1;
    }
    unsigned char ds_reset = static_cast<unsigned char>((status & 0x00000006)>>1);
    if (ds_reset != 1) {
        std::cerr << "Failed to communicate with DS2505" << std::endl;
        if (ds_reset == 2)
            std::cerr << "  - DOUT3 did not reach high state -- is pullup resistor missing?" << std::endl;
        else if (ds_reset == 3)
            std::cerr << "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?" << std::endl;
        return -1;
    }
    unsigned char family_code = static_cast<unsigned char>((status&0xFF000000)>>24);
    if (family_code != 0x0B) {
        std::cerr << "Unknown device family code: 0x" << std::hex << static_cast<unsigned int>(family_code)
                  << " (DS2505 should be 0x0B)" << std::endl;
        return -1;
    }
    bool useDS2480B = (status & 0x00008000) == 0x00008000;
    if (!useDS2480B) {
        unsigned char rise_time = static_cast<unsigned char>((status&0x00FF0000)>>16);
        std::cout << "Measured rise time: " << (rise_time/49.152) << " microseconds" << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to read instrument memory" << std::endl;
        return -1;
    }
    std::ofstream outFile("instrument.txt", std::ios::binary);
    if (outFile.good()) {
        outFile.write((char *)buffer, sizeof(buffer));
        std::cout << "Data written to instrument.txt" << std::endl;
    }
    else {
        std::cerr << "Failed to open instrument.txt for writing" << std::endl;
        return -1;
    }
    outFile.close();
    return 0;
}